

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O0

SymbolInfo *
ZXing::Pdf417::DetectSymbol<ZXing::PointT<double>>
          (BitMatrixCursor<ZXing::PointT<double>_> topCur,int width,int height)

{
  PointT<double> d;
  PointT<double> o;
  PointT<double> rowSkip_00;
  PointT<double> rowSkip_01;
  BitMatrixCursor<ZXing::PointT<double>_> topCur_00;
  BitMatrixCursor<ZXing::PointT<double>_> topCur_01;
  unsigned_short uVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  BitMatrixCursor<ZXing::PointT<double>_> *in_RDI;
  double dVar3;
  PointT<double> PVar4;
  SymbolInfo botSI;
  SymbolInfo topSI;
  this_t botCur;
  PointT<double> rowSkip;
  int colWidth;
  array<unsigned_short,_8UL> pat;
  PointT<double> *in_stack_fffffffffffffdd8;
  BitMatrixCursor<ZXing::PointT<double>_> *in_stack_fffffffffffffde0;
  float s;
  double in_stack_fffffffffffffde8;
  double in_stack_fffffffffffffdf0;
  double in_stack_fffffffffffffdf8;
  double in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  BitMatrixCursor<ZXing::PointT<double>_> *this;
  undefined4 in_stack_fffffffffffffe28;
  undefined1 *__src;
  undefined1 local_1b8 [56];
  int local_180;
  undefined4 local_17c;
  double local_168;
  double local_160;
  undefined1 local_158 [4];
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  double in_stack_fffffffffffffeb8;
  double in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffed0 [16];
  int in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4 [20];
  undefined1 local_e8 [40];
  PointT<double> local_c0;
  double local_b0;
  double local_a8;
  float local_a0;
  float local_9c;
  PointT<double> local_98;
  uint local_84;
  PointT<double> local_60;
  PointT<double> local_50;
  _Type local_18;
  int local_8;
  int local_4;
  
  __src = &stack0x00000008;
  iVar2 = in_EDX / 2;
  this = in_RDI;
  local_8 = in_EDX;
  local_4 = in_ESI;
  local_60 = BitMatrixCursor<ZXing::PointT<double>_>::right
                       ((BitMatrixCursor<ZXing::PointT<double>_> *)0x2cd394);
  local_50 = ZXing::operator*((int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                              in_stack_fffffffffffffdd8);
  PVar4.x._4_4_ = iVar2;
  PVar4.x._0_4_ = in_stack_fffffffffffffe28;
  PVar4.y = (double)__src;
  BitMatrixCursor<ZXing::PointT<double>_>::movedBy(this,PVar4);
  local_18 = (_Type)BitMatrixCursor<ZXing::PointT<double>>::
                    readPatternFromBlack<std::array<unsigned_short,8ul>>
                              (in_stack_fffffffffffffde0,
                               (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                               (int)in_stack_fffffffffffffdd8);
  PatternView::PatternView<8ul>
            ((PatternView *)in_stack_fffffffffffffde0,(Pattern<8UL> *)in_stack_fffffffffffffdd8);
  s = (float)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  dVar3 = IsPattern<false,8,17>
                    ((PatternView *)in_RDI,
                     (FixedPattern<8,_17,_false> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     in_stack_fffffffffffffe0c,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (dVar3 == 0.0) {
    *(undefined4 *)&in_RDI->img = 0;
    *(undefined4 *)((long)&in_RDI->img + 4) = 0;
    *(int *)&(in_RDI->p).x = 0;
    *(undefined4 *)((long)&(in_RDI->p).x + 4) = 0;
    *(undefined4 *)&(in_RDI->p).y = 0xffffffff;
    *(undefined4 *)((long)&(in_RDI->p).y + 4) = 0xffffffff;
    *(undefined4 *)&(in_RDI->d).x = 0xffffffff;
    *(undefined4 *)((long)&(in_RDI->d).x + 4) = 0;
    *(undefined4 *)&(in_RDI->d).y = 0;
  }
  else {
    uVar1 = Reduce<std::array<unsigned_short,8ul>,unsigned_short,std::plus<unsigned_short>>
                      (local_18,0);
    local_84 = (uint)uVar1;
    local_9c = (float)local_84 / 17.0;
    local_a0 = 1.0;
    std::max<float>(&local_9c,&local_a0);
    local_c0 = BitMatrixCursor<ZXing::PointT<double>_>::right
                         ((BitMatrixCursor<ZXing::PointT<double>_> *)0x2cd522);
    d.y = in_stack_fffffffffffffdf0;
    d.x = in_stack_fffffffffffffde8;
    PVar4 = bresenhamDirection<double>(d);
    local_a8 = PVar4.y;
    local_b0 = PVar4.x;
    local_98 = ZXing::operator*(s,in_stack_fffffffffffffdd8);
    BitMatrixCursor<ZXing::PointT<double>_>::right
              ((BitMatrixCursor<ZXing::PointT<double>_> *)0x2cd59d);
    ZXing::operator*((int)s,in_stack_fffffffffffffdd8);
    o.x._4_4_ = iVar2;
    o.x._0_4_ = in_stack_fffffffffffffe28;
    o.y = (double)__src;
    BitMatrixCursor<ZXing::PointT<double>_>::movedBy(this,o);
    memcpy(local_158,__src,0x28);
    local_168 = local_98.x;
    local_160 = local_98.y;
    topCur_00.p.y._0_4_ = in_stack_fffffffffffffee0;
    topCur_00.img = (BitMatrix *)in_stack_fffffffffffffed0._0_8_;
    topCur_00.p.x = (double)in_stack_fffffffffffffed0._8_8_;
    topCur_00._20_20_ = in_stack_fffffffffffffee4;
    rowSkip_00.y = in_stack_fffffffffffffec0;
    rowSkip_00.x = in_stack_fffffffffffffeb8;
    ReadSymbolInfo<ZXing::PointT<double>>
              (topCur_00,rowSkip_00,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    memcpy(local_1b8,local_e8,0x28);
    ZXing::operator-((PointT<double> *)0x2cd6ab);
    topCur_01.p.y._0_4_ = in_stack_fffffffffffffee0;
    topCur_01.img = (BitMatrix *)in_stack_fffffffffffffed0._0_8_;
    topCur_01.p.x = (double)in_stack_fffffffffffffed0._8_8_;
    topCur_01._20_20_ = in_stack_fffffffffffffee4;
    rowSkip_01.y = in_stack_fffffffffffffec0;
    rowSkip_01.x = in_stack_fffffffffffffeb8;
    ReadSymbolInfo<ZXing::PointT<double>>
              (topCur_01,rowSkip_01,in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    memcpy(in_RDI,&stack0xfffffffffffffed4,0x24);
    *(undefined4 *)((long)&(in_RDI->p).y + 4) = local_17c;
    iVar2 = *(int *)((long)&(in_RDI->p).y + 4) - *(int *)&(in_RDI->p).y;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    *(float *)&(in_RDI->d).y = (float)local_8 / (float)(iVar2 + 1);
    if (in_stack_fffffffffffffee0 != local_180) {
      *(int *)((long)&(in_RDI->p).x + 4) =
           (local_4 + *(int *)((long)&(in_RDI->d).x + 4) / 2) / *(int *)((long)&(in_RDI->d).x + 4) +
           -4;
    }
  }
  return (SymbolInfo *)this;
}

Assistant:

SymbolInfo DetectSymbol(BitMatrixCursor<POINT> topCur, int width, int height)
{
	auto pat = topCur.movedBy(height / 2 * topCur.right()).template readPatternFromBlack<Pattern417>(1, width / 3);
	if (!IsPattern(pat, START_PATTERN))
		return {};
	int colWidth = Reduce(pat);
	auto rowSkip = std::max(colWidth / 17.f, 1.f) * bresenhamDirection(topCur.right());
	auto botCur  = topCur.movedBy((height - 1) * topCur.right());

	auto topSI = ReadSymbolInfo(topCur, rowSkip, colWidth, width, height);
	auto botSI = ReadSymbolInfo(botCur, -rowSkip, colWidth, width, height);

	SymbolInfo res = topSI;
	res.lastRow = botSI.firstRow;
	res.rowHeight = float(height) / (std::abs(res.lastRow - res.firstRow) + 1);
	if (topSI.nCols != botSI.nCols)
		// if there is something fishy with the number of cols (aliasing), guess them from the width
		res.nCols = (width + res.colWidth / 2) / res.colWidth - 4;

	return res;
}